

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O2

string * __thiscall
SchemaConverter::format_grammar_abi_cxx11_(string *__return_storage_ptr__,SchemaConverter *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  stringstream ss;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  for (p_Var2 = (this->_rules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->_rules)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(local_1a0,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1," ::= ");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 2));
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string format_grammar() {
        std::stringstream ss;
        for (const auto & kv : _rules) {
            ss << kv.first << " ::= " << kv.second << std::endl;
        }
        return ss.str();
    }